

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerProfiledLdFld(Lowerer *this,JitProfilingInstr *ldFldInstr)

{
  LowererMD *pLVar1;
  OpCode OVar2;
  Instr *pIVar3;
  Func *func;
  code *pcVar4;
  OpndKind OVar5;
  bool bVar6;
  byte bVar7;
  Opnd *this_00;
  undefined4 *puVar8;
  RegOpnd *pRVar9;
  PropertySymOpnd *pPVar10;
  IntConstOpnd *pIVar11;
  HelperCallOpnd *this_01;
  Opnd *opndArg;
  JnHelperMethod fnHelper;
  
  pIVar3 = (ldFldInstr->super_Instr).m_prev;
  this_00 = IR::Instr::UnlinkSrc1(&ldFldInstr->super_Instr);
  OVar5 = IR::Opnd::GetKind(this_00);
  if (OVar5 == OpndKindSym) {
    OVar5 = IR::Opnd::GetKind(this_00);
    if (OVar5 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar6) goto LAB_005c72e5;
      *puVar8 = 0;
    }
    if (*(char *)((long)this_00[1]._vptr_Opnd + 0x14) != '\x02') goto LAB_005c6e64;
  }
  else {
LAB_005c6e64:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1637,"(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym())",
                       "Expected property sym as src");
    if (!bVar6) goto LAB_005c72e5;
    *puVar8 = 0;
  }
  OVar2 = (ldFldInstr->super_Instr).m_opcode;
  if (OVar2 < LdLen_A) {
    switch(OVar2) {
    case LdFldForTypeOf:
      fnHelper = HelperProfiledLdFldForTypeOf;
      break;
    case ProfiledLdFldForTypeOf:
    case ProfiledLdFldForCallApplyTarget:
    case ProfiledLdRootFld:
    case ProfiledLdMethodFld:
switchD_005c6ee0_caseD_67:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1695,"(false)","false");
      if (!bVar6) goto LAB_005c72e5;
      *puVar8 = 0;
      fnHelper = HelperInvalid;
      goto LAB_005c703f;
    case LdFldForCallApplyTarget:
      fnHelper = HelperProfiledLdFld_CallApplyTarget;
      break;
    case LdRootFld:
      fnHelper = HelperProfiledLdRootFld;
      break;
    case LdMethodFld:
      fnHelper = HelperProfiledLdMethodFld;
      break;
    case LdRootMethodFld:
      fnHelper = HelperProfiledLdRootMethodFld;
      break;
    default:
      fnHelper = HelperProfiledLdFld;
      if (OVar2 != LdFld) goto switchD_005c6ee0_caseD_67;
    }
LAB_005c6f9a:
    if (ldFldInstr->profileId != 0xffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1654,"(ldFldInstr->profileId == Js::Constants::NoProfileId)",
                         "ldFldInstr->profileId == Js::Constants::NoProfileId");
      if (!bVar6) goto LAB_005c72e5;
      *puVar8 = 0;
    }
    pRVar9 = IR::Opnd::CreateFramePointerOpnd(this->m_func);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,&ldFldInstr->super_Instr,&pRVar9->super_Opnd);
    pPVar10 = IR::Opnd::AsPropertySymOpnd(this_00);
    pIVar11 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar10->m_inlineCacheIndex,this->m_func);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,&ldFldInstr->super_Instr,&pIVar11->super_Opnd);
    LoadPropertySymAsArgument(this,&ldFldInstr->super_Instr,this_00);
  }
  else if (OVar2 == LdLen_A) {
    if (ldFldInstr->profileId == 0xffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1682,"(ldFldInstr->profileId != Js::Constants::NoProfileId)",
                         "ldFldInstr->profileId != Js::Constants::NoProfileId");
      if (!bVar6) goto LAB_005c72e5;
      *puVar8 = 0;
    }
    pLVar1 = &this->m_lowererMD;
    pRVar9 = IR::Opnd::CreateFramePointerOpnd(this->m_func);
    LowererMD::LoadHelperArgument(pLVar1,&ldFldInstr->super_Instr,&pRVar9->super_Opnd);
    pIVar11 = IR::Opnd::CreateProfileIdOpnd(ldFldInstr->profileId,this->m_func);
    LowererMD::LoadHelperArgument(pLVar1,&ldFldInstr->super_Instr,&pIVar11->super_Opnd);
    pPVar10 = IR::Opnd::AsPropertySymOpnd(this_00);
    pIVar11 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar10->m_inlineCacheIndex,this->m_func);
    LowererMD::LoadHelperArgument(pLVar1,&ldFldInstr->super_Instr,&pIVar11->super_Opnd);
    LoadPropertySymAsArgument(this,&ldFldInstr->super_Instr,this_00);
    fnHelper = HelperProfiledLdLen;
  }
  else {
    if (OVar2 != LdSuperFld) {
      if (OVar2 != LdRootFldForTypeOf) goto switchD_005c6ee0_caseD_67;
      fnHelper = HelperProfiledLdRootFldForTypeOf;
      goto LAB_005c6f9a;
    }
    if (ldFldInstr->profileId != 0xffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1668,"(ldFldInstr->profileId == Js::Constants::NoProfileId)",
                         "ldFldInstr->profileId == Js::Constants::NoProfileId");
      if (!bVar6) goto LAB_005c72e5;
      *puVar8 = 0;
    }
    opndArg = IR::Instr::UnlinkSrc2(&ldFldInstr->super_Instr);
    pLVar1 = &this->m_lowererMD;
    LowererMD::LoadHelperArgument(pLVar1,&ldFldInstr->super_Instr,opndArg);
    pRVar9 = IR::Opnd::CreateFramePointerOpnd(this->m_func);
    LowererMD::LoadHelperArgument(pLVar1,&ldFldInstr->super_Instr,&pRVar9->super_Opnd);
    pPVar10 = IR::Opnd::AsPropertySymOpnd(this_00);
    pIVar11 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar10->m_inlineCacheIndex,this->m_func);
    LowererMD::LoadHelperArgument(pLVar1,&ldFldInstr->super_Instr,&pIVar11->super_Opnd);
    LoadPropertySymAsArgument(this,&ldFldInstr->super_Instr,this_00);
    fnHelper = HelperProfiledLdSuperFld;
  }
LAB_005c703f:
  this_01 = IR::HelperCallOpnd::New(fnHelper,this->m_func);
  if ((ldFldInstr->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar6) goto LAB_005c72e5;
    *puVar8 = 0;
  }
  func = (ldFldInstr->super_Instr).m_func;
  if ((this_01->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar6) {
LAB_005c72e5:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  bVar7 = (this_01->super_Opnd).field_0xb;
  if ((bVar7 & 2) != 0) {
    this_01 = (HelperCallOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,func);
    bVar7 = (this_01->super_Opnd).field_0xb;
  }
  (this_01->super_Opnd).field_0xb = bVar7 | 2;
  (ldFldInstr->super_Instr).m_src1 = &this_01->super_Opnd;
  LowererMD::LowerCall(&this->m_lowererMD,&ldFldInstr->super_Instr,0);
  return pIVar3;
}

Assistant:

IR::Instr *
Lowerer::LowerProfiledLdFld(IR::JitProfilingInstr *ldFldInstr)
{
    const auto instrPrev = ldFldInstr->m_prev;

    auto src = ldFldInstr->UnlinkSrc1();
    AssertMsg(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym(), "Expected property sym as src");

    IR::JnHelperMethod helper = IR::HelperInvalid;
    switch (ldFldInstr->m_opcode)
    {
        case Js::OpCode::LdFld:
            helper = IR::HelperProfiledLdFld;
            goto ldFldCommon;
        case Js::OpCode::LdRootFld:
            helper = IR::HelperProfiledLdRootFld;
            goto ldFldCommon;
        case Js::OpCode::LdMethodFld:
            helper = IR::HelperProfiledLdMethodFld;
            goto ldFldCommon;
        case Js::OpCode::LdRootMethodFld:
            helper = IR::HelperProfiledLdRootMethodFld;
            goto ldFldCommon;
        case Js::OpCode::LdFldForCallApplyTarget:
            helper = IR::HelperProfiledLdFld_CallApplyTarget;
            goto ldFldCommon;
        case Js::OpCode::LdFldForTypeOf:
            helper = IR::HelperProfiledLdFldForTypeOf;
            goto ldFldCommon;
        case Js::OpCode::LdRootFldForTypeOf:
            helper = IR::HelperProfiledLdRootFldForTypeOf;
            goto ldFldCommon;

ldFldCommon:
        {
            Assert(ldFldInstr->profileId == Js::Constants::NoProfileId);

            /*
                Var ProfilingHelpers::ProfiledLdFld_Jit(
                    const Var instance,
                    const PropertyId propertyId,
                    const InlineCacheIndex inlineCacheIndex,
                    void *const framePointer)
            */

            m_lowererMD.LoadHelperArgument(ldFldInstr, IR::Opnd::CreateFramePointerOpnd(m_func));
            m_lowererMD.LoadHelperArgument(
                ldFldInstr,
                IR::Opnd::CreateInlineCacheIndexOpnd(src->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));
            LoadPropertySymAsArgument(ldFldInstr, src);
            break;
        }

        case Js::OpCode::LdSuperFld:
        {
            Assert(ldFldInstr->profileId == Js::Constants::NoProfileId);

            IR::Opnd * src2 = nullptr;

            /*
                Var ProfilingHelpers::ProfiledLdSuperFld_Jit(
                    const Var instance,
                    const PropertyId propertyId,
                    const InlineCacheIndex inlineCacheIndex,
                    void *const framePointer,
                    const Var thisInstance)
            */

            src2 = ldFldInstr->UnlinkSrc2();

            m_lowererMD.LoadHelperArgument(ldFldInstr, src2 );
            m_lowererMD.LoadHelperArgument(ldFldInstr, IR::Opnd::CreateFramePointerOpnd(m_func));
            m_lowererMD.LoadHelperArgument(
                ldFldInstr,
                IR::Opnd::CreateInlineCacheIndexOpnd(src->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));
            LoadPropertySymAsArgument(ldFldInstr, src);
            helper = IR::HelperProfiledLdSuperFld;
            break;
        }

        case Js::OpCode::LdLen_A:
            Assert(ldFldInstr->profileId != Js::Constants::NoProfileId);

            /*
                Var ProfilingHelpers::ProfiledLdLen_Jit(
                    const Var instance,
                    const PropertyId propertyId,
                    const InlineCacheIndex inlineCacheIndex,
                    const ProfileId profileId,
                    void *const framePointer)
            */

            m_lowererMD.LoadHelperArgument(ldFldInstr, IR::Opnd::CreateFramePointerOpnd(m_func));
            m_lowererMD.LoadHelperArgument(ldFldInstr, IR::Opnd::CreateProfileIdOpnd(ldFldInstr->profileId, m_func));
            m_lowererMD.LoadHelperArgument(ldFldInstr, IR::Opnd::CreateInlineCacheIndexOpnd(src->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));
            LoadPropertySymAsArgument(ldFldInstr, src);
            helper = IR::HelperProfiledLdLen;
            break;

        default:
            Assert(false);
    }

    ldFldInstr->SetSrc1(IR::HelperCallOpnd::New(helper, m_func));
    m_lowererMD.LowerCall(ldFldInstr, 0);

    return instrPrev;
}